

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsignalmapper.cpp
# Opt level: O3

void __thiscall QSignalMapper::removeMappings(QSignalMapper *this,QObject *sender)

{
  QObjectData *pQVar1;
  long in_FS_OFFSET;
  QObject *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  local_20 = sender;
  QHash<QObject*,int>::removeImpl<QObject*>
            ((QHash<QObject*,int> *)&pQVar1[1].children.d.size,&local_20);
  QHash<QObject*,QString>::removeImpl<QObject*>
            ((QHash<QObject*,QString> *)&pQVar1[1].field_0x30,&local_20);
  QHash<QObject*,QObject*>::removeImpl<QObject*>
            ((QHash<QObject*,QObject*> *)&pQVar1[1].metaObject,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSignalMapper::removeMappings(QObject *sender)
{
    Q_D(QSignalMapper);

    d->intHash.remove(sender);
    d->stringHash.remove(sender);
    d->objectHash.remove(sender);
}